

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.hpp
# Opt level: O2

VarType * __thiscall
glu::
getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
          (VarType *__return_storage_ptr__,glu *this,VarType *type,
          __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
          begin,__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                end)

{
  Type TVar1;
  Precision precision;
  bool bVar2;
  int vecSize;
  DataType dataType;
  TestError *this_00;
  
  bVar2 = isValidTypePath<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                    ((VarType *)this,
                     (__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                      )type,begin);
  if (!bVar2) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"isValidTypePath(type, begin, end)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.hpp"
               ,0x178);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  do {
    if (type == (VarType *)begin._M_current) {
      VarType::VarType(__return_storage_ptr__,(VarType *)this);
      return __return_storage_ptr__;
    }
    TVar1 = type->m_type;
    if (TVar1 == TYPE_ARRAY) {
      this = (glu *)(((VarType *)this)->m_data).array.elementType;
    }
    else {
      if (TVar1 != TYPE_BASIC) {
        dataType = (((VarType *)this)->m_data).basic.type;
        precision = (((VarType *)this)->m_data).basic.precision;
        if (TVar1 == TYPE_STRUCT) {
          vecSize = getDataTypeMatrixNumRows(dataType);
          dataType = getDataTypeFloatVec(vecSize);
          type = (VarType *)&type->m_data;
        }
        if ((type != (VarType *)begin._M_current) && (type->m_type == TYPE_LAST)) {
          dataType = getDataTypeScalarType(dataType);
        }
        VarType::VarType(__return_storage_ptr__,dataType,precision);
        return __return_storage_ptr__;
      }
      this = (glu *)&(((((VarType *)this)->m_data).structPtr)->m_members).
                     super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
                     _M_impl.super__Vector_impl_data._M_start[*(int *)&type->field_0x4].m_type;
    }
    type = (VarType *)&type->m_data;
  } while( true );
}

Assistant:

VarType getVarType (const VarType& type, Iterator begin, Iterator end)
{
	TCU_CHECK(isValidTypePath(type, begin, end));

	const VarType*	curType		= &type;
	Iterator		pathIter	= begin;

	// Process struct member and array element parts of path.
	while (pathIter != end)
	{
		if (pathIter->type == VarTypeComponent::STRUCT_MEMBER)
			curType = &curType->getStructPtr()->getMember(pathIter->index).getType();
		else if (pathIter->type == VarTypeComponent::ARRAY_ELEMENT)
			curType = &curType->getElementType();
		else
			break;

		++pathIter;
	}

	if (pathIter != end)
	{
		DataType	basicType	= curType->getBasicType();
		Precision	precision	= curType->getPrecision();

		if (pathIter->type == VarTypeComponent::MATRIX_COLUMN)
		{
			basicType = getDataTypeFloatVec(getDataTypeMatrixNumRows(basicType));
			++pathIter;
		}

		if (pathIter != end && pathIter->type == VarTypeComponent::VECTOR_COMPONENT)
		{
			basicType = getDataTypeScalarType(basicType);
			++pathIter;
		}

		DE_ASSERT(pathIter == end);
		return VarType(basicType, precision);
	}
	else
		return VarType(*curType);
}